

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  pointer pbVar1;
  size_t i;
  long lVar2;
  long lVar3;
  text msg;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  text *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->opt).verbose == false) {
    std::__cxx11::string::string((string *)&local_78,"",(allocator *)&local_50);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::_M_dispose();
  }
  else {
    local_78 = local_68;
    local_70 = 0;
    local_68[0] = 0;
    lVar3 = 0;
    local_58 = __return_storage_ptr__;
    for (lVar2 = 0; __return_storage_ptr__ = local_58,
        pbVar1 = (this->ctx).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar2 != (long)(this->ctx).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
        lVar2 = lVar2 + 1) {
      std::operator+(&local_50,"\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
      std::__cxx11::string::append((string *)&local_78);
      std::__cxx11::string::_M_dispose();
      lVar3 = lVar3 + 0x20;
    }
    std::__cxx11::string::string((string *)local_58,(string *)&local_78);
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }